

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_masked_sprite_16px_right(tgestate_t *state,uint8_t x)

{
  byte bVar1;
  byte *pbVar2;
  byte in_SIL;
  tgestate_t *in_RDI;
  int carry_out_14;
  int carry_out_13;
  int carry_out_12;
  int carry_out_11;
  int carry_out_10;
  int carry_out_9;
  int carry_out_8;
  int carry_out_7;
  int carry_out_6;
  int carry_out_5;
  int carry_out_4;
  int carry_out_3;
  int carry_out_2;
  int carry_out_1;
  int carry_out;
  int carry;
  uint8_t mask2;
  uint8_t mask1;
  uint8_t mask0;
  uint8_t bm2;
  uint8_t bm1;
  uint8_t bm0;
  uint8_t *screenptr;
  uint8_t *foremaskptr;
  uint8_t *bitmapptr;
  uint8_t *maskptr;
  uint8_t iters;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  byte *local_30;
  byte *local_28;
  byte *local_20;
  byte *local_18;
  uint8_t local_a;
  byte local_9;
  tgestate_t *local_8;
  
  local_9 = (in_SIL ^ 0xff) & 3;
  local_18 = in_RDI->mask_pointer;
  local_20 = in_RDI->bitmap_pointer;
  local_a = (in_RDI->spriteplotter).height_16_left;
  local_8 = in_RDI;
  do {
    pbVar2 = local_20 + 1;
    local_31 = *local_20;
    local_20 = local_20 + 2;
    local_32 = *pbVar2;
    pbVar2 = local_18 + 1;
    local_34 = *local_18;
    local_18 = local_18 + 2;
    local_35 = *pbVar2;
    if ((local_8->sprite_index & 0x80) != 0) {
      flip_16_masked_pixels(local_8,&local_34,&local_35,&local_31,&local_32);
    }
    local_28 = local_8->foreground_mask_pointer;
    local_36 = 0xff;
    if (local_9 == 0) {
      local_36 = local_35 << 7 | 0x7f;
      local_35 = (byte)((int)(uint)local_35 >> 1) | local_34 << 7;
      local_34 = (byte)((int)(uint)local_34 >> 1) | 0x80;
    }
    bVar1 = 1;
    if (local_9 < 2) {
      bVar1 = local_36 & 1;
      local_36 = (byte)((int)(uint)local_36 >> 1) | local_35 << 7;
      local_35 = (byte)((int)(uint)local_35 >> 1) | local_34 << 7;
      local_34 = (byte)((int)(uint)local_34 >> 1) | 0x80;
    }
    if (local_9 < 3) {
      local_36 = (byte)((int)(uint)local_36 >> 1) | local_35 << 7;
      local_35 = (byte)((int)(uint)local_35 >> 1) | local_34 << 7;
      local_34 = (byte)((int)(uint)local_34 >> 1) | bVar1 << 7;
    }
    local_33 = 0;
    if (local_9 == 0) {
      local_33 = local_32 << 7;
      local_32 = (byte)((int)(uint)local_32 >> 1) | local_31 << 7;
      local_31 = (byte)((int)(uint)local_31 >> 1);
    }
    if (local_9 < 2) {
      local_33 = (byte)((int)(uint)local_33 >> 1) | local_32 << 7;
      local_32 = (byte)((int)(uint)local_32 >> 1) | local_31 << 7;
      local_31 = (byte)((int)(uint)local_31 >> 1);
    }
    if (local_9 < 3) {
      local_33 = (byte)((int)(uint)local_33 >> 1) | local_32 << 7;
      local_32 = (byte)((int)(uint)local_32 >> 1) | local_31 << 7;
      local_31 = (byte)((int)(uint)local_31 >> 1);
    }
    local_30 = local_8->window_buf_pointer;
    if ((local_8->spriteplotter).enable_16_left_1 != '\0') {
      *local_30 = (*local_28 ^ 0xff | local_34) & *local_30 | local_31 & *local_28;
    }
    if ((local_8->spriteplotter).enable_16_left_2 != '\0') {
      local_30[1] = (local_28[1] ^ 0xff | local_35) & local_30[1] | local_32 & local_28[1];
    }
    local_30 = local_30 + 2;
    if ((local_8->spriteplotter).enable_16_left_3 != '\0') {
      *local_30 = (local_28[2] ^ 0xff | local_36) & *local_30 | local_33 & local_28[2];
    }
    local_28 = local_28 + 4;
    local_8->foreground_mask_pointer = local_28;
    local_30 = local_30 + (local_8->columns + -2);
    local_8->window_buf_pointer = local_30;
    local_a = local_a + 0xff;
  } while (local_a != '\0');
  return;
}

Assistant:

void plot_masked_sprite_16px_right(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x < 4);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x = (~x & 3); /* jump table offset (on input, x is 0..3) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_left; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    uint8_t bm0, bm1, bm2;       /* was D, E, C */
    uint8_t mask0, mask1, mask2; /* was D', E', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm0 = *bitmapptr++;
    bm1 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask0 = *maskptr++;
    mask1 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask0, &mask1, &bm0, &bm1);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* In the 24 pixel-wide plotter it does bitmap rotates THEN mask rotates.
     * Is this the opposite way around to save a bank switch? */

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 1)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 2)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    //carry = 0; in original code but never read in practice
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 1)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 2)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_left_1)
      *screenptr = MASK(bm0, mask0);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_3)
      *screenptr = MASK(bm2, mask2);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}